

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_GLSL_DEFI(Context *ctx)

{
  int32 *x;
  char varname [64];
  Context *ctx_local;
  
  get_GLSL_destarg_varname(ctx,(char *)&x,0x40);
  push_output(ctx,&ctx->globals);
  output_line(ctx,"const ivec4 %s = ivec4(%d, %d, %d, %d);",&x,(ulong)ctx->dwords[0],
              (ulong)ctx->dwords[1],(ulong)ctx->dwords[2],ctx->dwords[3]);
  pop_output(ctx);
  return;
}

Assistant:

static void emit_GLSL_DEFI(Context *ctx)
{
    char varname[64]; get_GLSL_destarg_varname(ctx, varname, sizeof (varname));
    const int32 *x = (const int32 *) ctx->dwords;
    push_output(ctx, &ctx->globals);
    output_line(ctx, "const ivec4 %s = ivec4(%d, %d, %d, %d);",
                varname, (int) x[0], (int) x[1], (int) x[2], (int) x[3]);
    pop_output(ctx);
}